

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

double hungarian_algorithm::
       solve<double,unsigned_long,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<double>>
                 (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *cost_function,unsigned_long num_rows,unsigned_long num_cols,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map,
                 less<double> *cost_comparator)

{
  double dVar1;
  double local_138;
  undefined1 local_130 [8];
  HungarianSolver<double,_unsigned_long,_std::less<double>_> solver;
  less<double> *cost_comparator_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map_local;
  unsigned_long num_cols_local;
  unsigned_long num_rows_local;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *cost_function_local;
  
  local_138 = 0.0;
  solver.cost_matrix_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)cost_comparator;
  HungarianSolver<double,_unsigned_long,_std::less<double>_>::HungarianSolver
            ((HungarianSolver<double,_unsigned_long,_std::less<double>_> *)local_130,num_rows,
             num_cols,cost_comparator,&local_138);
  HungarianSolver<double,unsigned_long,std::less<double>>::
  solve<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            ((HungarianSolver<double,unsigned_long,std::less<double>> *)local_130,cost_function);
  dVar1 = HungarianSolver<double,unsigned_long,std::less<double>>::
          getAssignment<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((HungarianSolver<double,unsigned_long,std::less<double>> *)local_130,
                     cost_function,assignment_map);
  HungarianSolver<double,_unsigned_long,_std::less<double>_>::~HungarianSolver
            ((HungarianSolver<double,_unsigned_long,_std::less<double>_> *)local_130);
  return dVar1;
}

Assistant:

Cost solve(const CostFunction& cost_function, const Size num_rows, const Size num_cols, AssignmentMap& assignment_map,
           const CostComparator& cost_comparator)
{
  HungarianSolver<Cost, Size, CostComparator> solver(num_rows, num_cols, cost_comparator, Cost());
  solver.solve(cost_function);
  return solver.getAssignment(cost_function, assignment_map);
}